

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O2

void shared_ownership(shared_ptr<A> *s_ptr)

{
  ostream *poVar1;
  __shared_ptr<A,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Took ownership of: ");
  poVar1 = operator<<(poVar1,(s_ptr->super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"use_count: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1,'\n');
  std::__shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&s_ptr->super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>);
  shared_ownership2((shared_ptr<A> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  poVar1 = std::operator<<((ostream *)&std::cout,"use_count: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void shared_ownership(std::shared_ptr<A> s_ptr)
{
    std::cout << "Took ownership of: " << *s_ptr << '\n';
    std::cout << "use_count: " << s_ptr.use_count() << '\n';
    shared_ownership2(s_ptr);
    std::cout << "use_count: " << s_ptr.use_count() << '\n';
}